

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SchemaInfo.hpp
# Opt level: O3

SchemaInfo * __thiscall xercesc_4_0::SchemaInfo::getImportInfo(SchemaInfo *this,uint namespaceURI)

{
  XMLSize_t XVar1;
  SchemaInfo *pSVar2;
  XMLSize_t getAt;
  
  if ((this->fImportedInfoList != (RefVectorOf<xercesc_4_0::SchemaInfo> *)0x0) &&
     (XVar1 = (this->fImportedInfoList->super_BaseRefVectorOf<xercesc_4_0::SchemaInfo>).fCurCount,
     XVar1 != 0)) {
    getAt = 0;
    do {
      pSVar2 = BaseRefVectorOf<xercesc_4_0::SchemaInfo>::elementAt
                         (&this->fImportedInfoList->super_BaseRefVectorOf<xercesc_4_0::SchemaInfo>,
                          getAt);
      if (pSVar2->fTargetNSURI == namespaceURI) {
        return pSVar2;
      }
      getAt = getAt + 1;
    } while (XVar1 != getAt);
  }
  return (SchemaInfo *)0x0;
}

Assistant:

inline SchemaInfo* SchemaInfo::getImportInfo(const unsigned int namespaceURI) const {

    XMLSize_t importSize = (fImportedInfoList) ? fImportedInfoList->size() : 0;
    SchemaInfo* currInfo = 0;

    for (XMLSize_t i=0; i < importSize; i++) {

        currInfo = fImportedInfoList->elementAt(i);

        if (currInfo->getTargetNSURI() == (int) namespaceURI)
            return currInfo;
    }

    return 0;
}